

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyInt32Uint32(void)

{
  bool bVar1;
  TestCase<int,_unsigned_int,_0> TVar2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  int32_t ret;
  TestCase<int,_unsigned_int,_0> test;
  TestVector<int,_unsigned_int,_0> tests;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  allocator *in_stack_ffffffffffffff20;
  TestVector<int,_unsigned_int,_0> *in_stack_ffffffffffffff30;
  allocator local_a1;
  string local_a0 [36];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_7c;
  byte local_75;
  allocator<char> local_61;
  string local_60 [7];
  undefined1 in_stack_ffffffffffffffa7;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  undefined8 local_24;
  byte local_1c;
  TestVector<int,_unsigned_int,_0> local_18;
  
  TestVector<int,_unsigned_int,_0>::TestVector(&local_18);
  TVar2 = TestVector<int,_unsigned_int,_0>::GetNext(in_stack_ffffffffffffff30);
  local_24 = TVar2._0_8_;
  local_1c = TVar2.fExpected;
  while( true ) {
    bVar1 = TestVector<int,_unsigned_int,_0>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeMultiply<int,unsigned_int>
                      ((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (uint)in_stack_ffffffffffffff20,
                       (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (bVar1 != (bool)(local_1c & 1)) {
      in_stack_ffffffffffffff30 = (TestVector<int,_unsigned_int,_0> *)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case int_uint32: ",(allocator *)in_stack_ffffffffffffff30);
      err_msg<int,unsigned_int>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (bool)in_stack_ffffffffffffffa7);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
    }
    local_75 = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_7c,(int *)&local_24);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    if ((local_75 & 1) != (local_1c & 1)) {
      in_stack_ffffffffffffff20 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Error in case int_uint32 throw: ",in_stack_ffffffffffffff20);
      err_msg<int,unsigned_int>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (bool)in_stack_ffffffffffffffa7);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    TVar2 = TestVector<int,_unsigned_int,_0>::GetNext(in_stack_ffffffffffffff30);
    local_24 = TVar2._0_8_;
    local_1c = TVar2.fExpected;
  }
  return;
}

Assistant:

void MultVerifyInt32Uint32()
{
	TestVector< std::int32_t, std::uint32_t, OpType::Mult > tests;
	TestCase<std::int32_t, std::uint32_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int32_t ret;
		if (SafeMultiply(test.x, test.y, ret) != test.fExpected)
		{
			//assert(false);
			err_msg("Error in case int_uint32: ", test.x, test.y, test.fExpected);
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int32_t> si(test.x);
			si *= test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			err_msg("Error in case int_uint32 throw: ", test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}